

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts5MultiIterFree(Fts5Iter *pIter)

{
  long in_RDI;
  int i;
  undefined4 local_c;
  
  if (in_RDI != 0) {
    for (local_c = 0; local_c < *(int *)(in_RDI + 0x48); local_c = local_c + 1) {
      fts5SegIterClear((Fts5SegIter *)0x26b699);
    }
    sqlite3Fts5BufferFree((Fts5Buffer *)0x26b6b4);
    sqlite3_free((void *)0x26b6be);
  }
  return;
}

Assistant:

static void fts5MultiIterFree(Fts5Iter *pIter){
  if( pIter ){
    int i;
    for(i=0; i<pIter->nSeg; i++){
      fts5SegIterClear(&pIter->aSeg[i]);
    }
    fts5BufferFree(&pIter->poslist);
    sqlite3_free(pIter);
  }
}